

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

Fl_Help_Link * __thiscall Fl_Help_View::find_link(Fl_Help_View *this,int xx,int yy)

{
  Fl_Help_Link *local_30;
  Fl_Help_Link *local_28;
  Fl_Help_Link *linkp;
  int i;
  int yy_local;
  int xx_local;
  Fl_Help_View *this_local;
  
  linkp._4_4_ = this->nlinks_;
  for (local_28 = this->links_;
      (0 < linkp._4_4_ &&
      ((((xx < local_28->x || (local_28->w <= xx)) || (yy < local_28->y)) || (local_28->h <= yy))));
      local_28 = local_28 + 1) {
    linkp._4_4_ = linkp._4_4_ + -1;
  }
  if (linkp._4_4_ == 0) {
    local_30 = (Fl_Help_Link *)0x0;
  }
  else {
    local_30 = local_28;
  }
  return local_30;
}

Assistant:

Fl_Help_Link *Fl_Help_View::find_link(int xx, int yy)
{
  int		i;
  Fl_Help_Link	*linkp;
  for (i = nlinks_, linkp = links_; i > 0; i --, linkp ++) {
    if (xx >= linkp->x && xx < linkp->w &&
        yy >= linkp->y && yy < linkp->h)
      break;
  }
  return i ? linkp : 0L;
}